

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O2

int __thiscall FScanner::MatchString(FScanner *this,char **strings,size_t stride)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  if ((stride & 7) == 0) {
    iVar3 = 0;
    while ((iVar2 = -1, *strings != (char *)0x0 &&
           (bVar1 = Compare(this,*strings), iVar2 = iVar3, !bVar1))) {
      iVar3 = iVar3 + 1;
      strings = (char **)((long)strings + (stride & 0xfffffffffffffff8));
    }
    return iVar2;
  }
  __assert_fail("stride % sizeof(const char*) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/sc_man.cpp"
                ,0x345,"int FScanner::MatchString(const char *const *, size_t)");
}

Assistant:

int FScanner::MatchString (const char * const *strings, size_t stride)
{
	int i;

	assert(stride % sizeof(const char*) == 0);

	stride /= sizeof(const char*);

	for (i = 0; *strings != NULL; i++)
	{
		if (Compare (*strings))
		{
			return i;
		}
		strings += stride;
	}
	return -1;
}